

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskWriteCase::postDraw(SampleMaskWriteCase *this)

{
  deInt32 dVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (*(int *)&(this->super_SampleMaskBaseCase).field_0x12c == 1) {
    dVar1 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase
            .m_numTargetSamples;
    (**(code **)(lVar3 + 0x4e8))(0x8e51);
    (**(code **)(lVar3 + 0x1258))(0,~(-1 << ((byte)dVar1 & 0x1f)));
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"set mask",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x818);
  }
  SampleMaskBaseCase::postDraw(&this->super_SampleMaskBaseCase);
  return;
}

Assistant:

void SampleMaskWriteCase::postDraw (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_testMode == TEST_INVERSE)
	{
		const deUint32 fullMask	= (1U << m_numTargetSamples) - 1;

		gl.disable(GL_SAMPLE_MASK);
		gl.sampleMaski(0, fullMask);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set mask");
	}

	SampleMaskBaseCase::postDraw();
}